

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTextIO.cpp
# Opt level: O3

void __thiscall NaTextStreamFile::SetValue(NaTextStreamFile *this,NaReal fVal,int iVar)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  NaReal *pNVar4;
  NaReal *pNVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  NaReal NVar13;
  
  if (this->iCase == -1) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 1;
    __cxa_throw(puVar6,&NaException::typeinfo,0);
  }
  iVar2 = this->nVar;
  if ((long)iVar2 == 0) {
    uVar8 = (ulong)(iVar + 1U);
    this->nVar = iVar + 1U;
    uVar7 = 0xffffffffffffffff;
    if (-2 < iVar) {
      uVar7 = uVar8 * 8;
    }
    pNVar4 = (NaReal *)operator_new__(uVar7);
    this->fCurVal = pNVar4;
    auVar3 = _DAT_0015cfb0;
    if (-1 < iVar) {
      lVar9 = uVar8 - 1;
      auVar10._8_4_ = (int)lVar9;
      auVar10._0_8_ = lVar9;
      auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
      uVar7 = 0;
      auVar10 = auVar10 ^ _DAT_0015cfb0;
      auVar11 = _DAT_0015cfa0;
      do {
        auVar12 = auVar11 ^ auVar3;
        if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                    auVar10._4_4_ < auVar12._4_4_) & 1)) {
          NVar13 = fVal;
          if ((uint)iVar != uVar7) {
            NVar13 = 0.0;
          }
          pNVar4[uVar7] = NVar13;
        }
        if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
            auVar12._12_4_ <= auVar10._12_4_) {
          NVar13 = fVal;
          if ((ulong)(uint)iVar - 1 != uVar7) {
            NVar13 = 0.0;
          }
          pNVar4[uVar7 + 1] = NVar13;
        }
        uVar7 = uVar7 + 2;
        lVar9 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar9 + 2;
      } while ((uVar8 + 1 & 0xfffffffffffffffe) != uVar7);
    }
  }
  else {
    pNVar4 = this->fCurVal;
    if (iVar < iVar2) {
      pNVar4[iVar] = fVal;
    }
    else {
      uVar1 = iVar + 1;
      this->nVar = uVar1;
      uVar7 = 0xffffffffffffffff;
      if (-2 < iVar) {
        uVar7 = (ulong)uVar1 * 8;
      }
      pNVar5 = (NaReal *)operator_new__(uVar7);
      this->fCurVal = pNVar5;
      if (-1 < iVar) {
        uVar7 = 0;
        do {
          if ((long)uVar7 < (long)iVar2) {
            pNVar5[uVar7] = pNVar4[uVar7];
          }
          else if ((uint)iVar == uVar7) {
            pNVar5[(uint)iVar] = fVal;
          }
          else {
            pNVar5[uVar7] = 0.0;
          }
          uVar7 = uVar7 + 1;
        } while (uVar1 != uVar7);
      }
      if (pNVar4 != (NaReal *)0x0) {
        operator_delete__(pNVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

void    NaTextStreamFile::SetValue (NaReal fVal, int iVar)
{
    if(-1 == iCase)
        throw(na_out_of_range);

    if(0 == nVar){
        // Number of values in record is not defined yet
        nVar = iVar + 1;
        fCurVal = new NaReal[nVar];
        int    i;
        for(i = 0; i < nVar; ++i){
            if(i == iVar){
                fCurVal[i] = fVal;
            }else{
                fCurVal[i] = 0.;
            }
        }
    }else if(iVar < nVar){
        // Setting variable among known ones
        fCurVal[iVar] = fVal;
    }else if(iVar >= nVar){
        // Setting variable beyond known ones
        NaReal      *pOld = fCurVal;
        int    nOld = nVar;

        nVar = iVar + 1;
        fCurVal = new NaReal[nVar];
        int    i;
        for(i = 0; i < nVar; ++i){
            if(i < nOld){
                fCurVal[i] = pOld[i];
            }else if(i == iVar){
                fCurVal[i] = fVal;
            }else{
                fCurVal[i] = 0.;
            }
        }
        delete[] pOld;
    }
}